

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall Imf_3_2::Array<Imf_3_2::Rgba>::Array(Array<Imf_3_2::Rgba> *this,long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Rgba *pRVar3;
  ulong in_RSI;
  ulong *in_RDI;
  Rgba *local_48;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pRVar3 = (Rgba *)operator_new__(uVar2);
  if (in_RSI != 0) {
    local_48 = pRVar3;
    do {
      Rgba::Rgba(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pRVar3 + in_RSI);
  }
  in_RDI[1] = (ulong)pRVar3;
  *in_RDI = in_RSI;
  return;
}

Assistant:

Array (long size)
    {
        _data = new T[size];
        _size = size;
    }